

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O2

time_t __thiscall Date::time(Date *this,time_t *__timer)

{
  tm *__tp;
  time_t tVar1;
  tm local;
  tm tStack_38;
  
  if ((int)__timer == 1) {
    return this->mTime;
  }
  __tp = localtime_r(&this->mTime,&tStack_38);
  tVar1 = mktime(__tp);
  return tVar1;
}

Assistant:

time_t Date::time(Mode mode) const
{
    if (mode == UTC)
        return mTime;
#ifdef _WIN32
    return mktime(localtime(&mTime));
#else
    struct tm local;
    return mktime(localtime_r(&mTime, &local));
#endif
}